

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTests.cpp
# Opt level: O1

int __thiscall
deqp::gles31::Functional::anon_unknown_0::BufferVariableTestGroup::init
          (BufferVariableTestGroup *this,EVP_PKEY_CTX *ctx)

{
  Context *pCVar1;
  ContextType type;
  GLSLVersion glslVersion;
  int extraout_EAX;
  TestNode *pTVar2;
  Node *pNVar3;
  SharedPtrStateBase *pSVar4;
  Node *pNVar5;
  ResourceTestCase *pRVar6;
  int ndx;
  int iVar7;
  deInt32 *pdVar8;
  SharedPtr buffer;
  SharedPtr variable;
  SharedPtr defaultBlock;
  SharedPtr shader;
  SharedPtr program;
  SharedPtr bufferStorage;
  SharedPtr variable_2;
  SharedPtr binding;
  Node *local_d8;
  SharedPtrStateBase *pSStack_d0;
  MatrixOrder local_c8;
  SharedPtr local_b8;
  Node *local_a8;
  SharedPtrStateBase *pSStack_a0;
  Node *local_98;
  SharedPtrStateBase *pSStack_90;
  Node *local_88;
  SharedPtrStateBase *pSStack_80;
  SharedPtr local_78;
  SharedPtr local_68;
  Node *local_58;
  SharedPtrStateBase *pSStack_50;
  Context *local_40;
  ProgramResourceQueryTestTarget local_38;
  
  type.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCaseGroup).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  glslVersion = glu::getContextTypeGLSLVersion(type);
  pTVar2 = (TestNode *)operator_new(0x78);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,pCVar1->m_testCtx,"resource_list","Resource list");
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b41ef0;
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  generateBufferVariableBufferCaseBlocks
            ((this->super_TestCaseGroup).m_context,(TestCaseGroup *)pTVar2,glslVersion,
             generateBufferVariableResourceListBlockContentsProxy);
  pTVar2 = (TestNode *)operator_new(0x78);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,pCVar1->m_testCtx,"array_size","Array size");
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b41ef0;
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  generateBufferVariableBufferCaseBlocks
            ((this->super_TestCaseGroup).m_context,(TestCaseGroup *)pTVar2,glslVersion,
             generateBufferVariableArrayCases<(deqp::gles31::Functional::ProgramResourcePropFlags)2>
            );
  pTVar2 = (TestNode *)operator_new(0x78);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,pCVar1->m_testCtx,"array_stride","Array stride");
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b41ef0;
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  generateBufferVariableBufferCaseBlocks
            ((this->super_TestCaseGroup).m_context,(TestCaseGroup *)pTVar2,glslVersion,
             generateBufferVariableArrayCases<(deqp::gles31::Functional::ProgramResourcePropFlags)4>
            );
  pTVar2 = (TestNode *)operator_new(0x78);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,pCVar1->m_testCtx,"block_index","Block index");
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b41ef0;
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  local_40 = (this->super_TestCaseGroup).m_context;
  pNVar3 = (Node *)operator_new(0x28);
  pNVar3->m_type = TYPE_PROGRAM;
  (pNVar3->m_enclosingNode).m_ptr = (Node *)0x0;
  (pNVar3->m_enclosingNode).m_state = (SharedPtrStateBase *)0x0;
  pNVar3->_vptr_Node = (_func_int **)&PTR__Node_00b52730;
  *(undefined1 *)&pNVar3[1]._vptr_Node = 0;
  pSStack_80 = (SharedPtrStateBase *)0x0;
  local_88 = pNVar3;
  pSVar4 = (SharedPtrStateBase *)operator_new(0x20);
  pSVar4->strongRefCount = 0;
  pSVar4->weakRefCount = 0;
  pSVar4->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00b52798;
  pSVar4[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar3;
  pSVar4->strongRefCount = 1;
  pSVar4->weakRefCount = 1;
  pSStack_80 = pSVar4;
  pNVar5 = (Node *)operator_new(0x28);
  pNVar5->_vptr_Node = (_func_int **)&PTR__Node_00b52778;
  pNVar5->m_type = TYPE_SHADER;
  (pNVar5->m_enclosingNode).m_ptr = pNVar3;
  (pNVar5->m_enclosingNode).m_state = pSVar4;
  LOCK();
  pSVar4->strongRefCount = pSVar4->strongRefCount + 1;
  UNLOCK();
  LOCK();
  pdVar8 = &((pNVar5->m_enclosingNode).m_state)->weakRefCount;
  *pdVar8 = *pdVar8 + 1;
  UNLOCK();
  pNVar5->_vptr_Node = (_func_int **)&PTR__Node_00b527d8;
  *(undefined4 *)&pNVar5[1]._vptr_Node = 5;
  *(GLSLVersion *)((long)&pNVar5[1]._vptr_Node + 4) = glslVersion;
  pSStack_90 = (SharedPtrStateBase *)0x0;
  local_98 = pNVar5;
  pSVar4 = (SharedPtrStateBase *)operator_new(0x20);
  pSVar4->strongRefCount = 0;
  pSVar4->weakRefCount = 0;
  pSVar4->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00b52798;
  pSVar4[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar5;
  pSVar4->strongRefCount = 1;
  pSVar4->weakRefCount = 1;
  pSStack_90 = pSVar4;
  pNVar3 = (Node *)operator_new(0x20);
  pNVar3->_vptr_Node = (_func_int **)&PTR__Node_00b52778;
  pNVar3->m_type = TYPE_DEFAULT_BLOCK;
  (pNVar3->m_enclosingNode).m_ptr = pNVar5;
  (pNVar3->m_enclosingNode).m_state = pSVar4;
  LOCK();
  pSVar4->strongRefCount = pSVar4->strongRefCount + 1;
  UNLOCK();
  LOCK();
  pdVar8 = &((pNVar3->m_enclosingNode).m_state)->weakRefCount;
  *pdVar8 = *pdVar8 + 1;
  UNLOCK();
  pNVar3->_vptr_Node = (_func_int **)&PTR__Node_00b52810;
  pSStack_a0 = (SharedPtrStateBase *)0x0;
  local_a8 = pNVar3;
  pSVar4 = (SharedPtrStateBase *)operator_new(0x20);
  pSVar4->strongRefCount = 0;
  pSVar4->weakRefCount = 0;
  pSVar4->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00b52798;
  pSVar4[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar3;
  pSVar4->strongRefCount = 1;
  pSVar4->weakRefCount = 1;
  pSStack_a0 = pSVar4;
  pNVar5 = (Node *)operator_new(0x28);
  pNVar5->_vptr_Node = (_func_int **)&PTR__Node_00b52778;
  pNVar5->m_type = TYPE_STORAGE_QUALIFIER;
  (pNVar5->m_enclosingNode).m_ptr = pNVar3;
  (pNVar5->m_enclosingNode).m_state = pSVar4;
  LOCK();
  pSVar4->strongRefCount = pSVar4->strongRefCount + 1;
  UNLOCK();
  LOCK();
  pdVar8 = &((pNVar5->m_enclosingNode).m_state)->weakRefCount;
  *pdVar8 = *pdVar8 + 1;
  UNLOCK();
  pNVar5->_vptr_Node = (_func_int **)&PTR__Node_00b52848;
  *(undefined4 *)&pNVar5[1]._vptr_Node = 4;
  local_78.m_state = (SharedPtrStateBase *)0x0;
  local_78.m_ptr = pNVar5;
  pSVar4 = (SharedPtrStateBase *)operator_new(0x20);
  pSVar4->strongRefCount = 0;
  pSVar4->weakRefCount = 0;
  pSVar4->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00b52798;
  pSVar4[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar5;
  pSVar4->strongRefCount = 1;
  pSVar4->weakRefCount = 1;
  local_78.m_state = pSVar4;
  pNVar3 = (Node *)operator_new(0x38);
  glu::Layout::Layout((Layout *)&local_d8,-1,0,-1,FORMATLAYOUT_LAST,MATRIXORDER_LAST);
  pNVar3->_vptr_Node = (_func_int **)&PTR__Node_00b52778;
  pNVar3->m_type = TYPE_LAYOUT_QUALIFIER;
  (pNVar3->m_enclosingNode).m_ptr = pNVar5;
  (pNVar3->m_enclosingNode).m_state = pSVar4;
  LOCK();
  pSVar4->strongRefCount = pSVar4->strongRefCount + 1;
  UNLOCK();
  LOCK();
  pdVar8 = &((pNVar3->m_enclosingNode).m_state)->weakRefCount;
  *pdVar8 = *pdVar8 + 1;
  UNLOCK();
  pNVar3->_vptr_Node = (_func_int **)&PTR__Node_00b52a10;
  pNVar3[1]._vptr_Node = (_func_int **)local_d8;
  *(SharedPtrStateBase **)&pNVar3[1].m_type = pSStack_d0;
  *(MatrixOrder *)&pNVar3[1].m_enclosingNode.m_ptr = local_c8;
  pSStack_50 = (SharedPtrStateBase *)0x0;
  local_58 = pNVar3;
  pSVar4 = (SharedPtrStateBase *)operator_new(0x20);
  pSVar4->strongRefCount = 0;
  pSVar4->weakRefCount = 0;
  pSVar4->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00b52798;
  pSVar4[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar3;
  pSVar4->strongRefCount = 1;
  pSVar4->weakRefCount = 1;
  pSStack_50 = pSVar4;
  pNVar5 = (Node *)operator_new(0x28);
  pNVar5->_vptr_Node = (_func_int **)&PTR__Node_00b52778;
  pNVar5->m_type = TYPE_INTERFACE_BLOCK;
  (pNVar5->m_enclosingNode).m_ptr = pNVar3;
  (pNVar5->m_enclosingNode).m_state = pSVar4;
  LOCK();
  pSVar4->strongRefCount = pSVar4->strongRefCount + 1;
  UNLOCK();
  LOCK();
  pdVar8 = &((pNVar5->m_enclosingNode).m_state)->weakRefCount;
  *pdVar8 = *pdVar8 + 1;
  UNLOCK();
  pNVar5->_vptr_Node = (_func_int **)&PTR__Node_00b52880;
  *(undefined1 *)&pNVar5[1]._vptr_Node = 1;
  pSStack_d0 = (SharedPtrStateBase *)0x0;
  local_d8 = pNVar5;
  pSVar4 = (SharedPtrStateBase *)operator_new(0x20);
  pSVar4->strongRefCount = 0;
  pSVar4->weakRefCount = 0;
  pSVar4->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00b52798;
  pSVar4[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar5;
  pSVar4->strongRefCount = 1;
  pSVar4->weakRefCount = 1;
  pSStack_d0 = pSVar4;
  pNVar3 = (Node *)operator_new(0x28);
  pNVar3->_vptr_Node = (_func_int **)&PTR__Node_00b52778;
  pNVar3->m_type = TYPE_VARIABLE;
  (pNVar3->m_enclosingNode).m_ptr = pNVar5;
  (pNVar3->m_enclosingNode).m_state = pSVar4;
  LOCK();
  pSVar4->strongRefCount = pSVar4->strongRefCount + 1;
  UNLOCK();
  LOCK();
  pdVar8 = &((pNVar3->m_enclosingNode).m_state)->weakRefCount;
  *pdVar8 = *pdVar8 + 1;
  UNLOCK();
  pNVar3->_vptr_Node = (_func_int **)&PTR__Node_00b528f0;
  *(undefined4 *)&pNVar3[1]._vptr_Node = 4;
  local_b8.m_state = (SharedPtrStateBase *)0x0;
  local_b8.m_ptr = pNVar3;
  pSVar4 = (SharedPtrStateBase *)operator_new(0x20);
  pSVar4->strongRefCount = 0;
  pSVar4->weakRefCount = 0;
  pSVar4->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00b52798;
  pSVar4[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar3;
  pSVar4->strongRefCount = 1;
  pSVar4->weakRefCount = 1;
  local_b8.m_state = pSVar4;
  pRVar6 = (ResourceTestCase *)operator_new(0xb0);
  ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
            ((ProgramResourceQueryTestTarget *)&local_68,PROGRAMINTERFACE_BUFFER_VARIABLE,0x10);
  ResourceTestCase::ResourceTestCase
            (pRVar6,local_40,&local_b8,(ProgramResourceQueryTestTarget *)&local_68,"named_block");
  tcu::TestNode::addChild(pTVar2,(TestNode *)pRVar6);
  pdVar8 = &pSVar4->strongRefCount;
  LOCK();
  *pdVar8 = *pdVar8 + -1;
  UNLOCK();
  if (*pdVar8 == 0) {
    local_b8.m_ptr = (Node *)0x0;
    (*(local_b8.m_state)->_vptr_SharedPtrStateBase[2])();
  }
  LOCK();
  pdVar8 = &(local_b8.m_state)->weakRefCount;
  *pdVar8 = *pdVar8 + -1;
  UNLOCK();
  if (*pdVar8 == 0) {
    if (local_b8.m_state != (SharedPtrStateBase *)0x0) {
      (*(local_b8.m_state)->_vptr_SharedPtrStateBase[1])();
    }
    local_b8.m_state = (SharedPtrStateBase *)0x0;
  }
  if (pSStack_d0 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar8 = &pSStack_d0->strongRefCount;
    *pdVar8 = *pdVar8 + -1;
    UNLOCK();
    if (*pdVar8 == 0) {
      local_d8 = (Node *)0x0;
      (*pSStack_d0->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar8 = &pSStack_d0->weakRefCount;
    *pdVar8 = *pdVar8 + -1;
    UNLOCK();
    if (*pdVar8 == 0) {
      if (pSStack_d0 != (SharedPtrStateBase *)0x0) {
        (*pSStack_d0->_vptr_SharedPtrStateBase[1])();
      }
      pSStack_d0 = (SharedPtrStateBase *)0x0;
    }
  }
  pNVar3 = (Node *)operator_new(0x28);
  pNVar3->_vptr_Node = (_func_int **)&PTR__Node_00b52778;
  pNVar3->m_type = TYPE_INTERFACE_BLOCK;
  (pNVar3->m_enclosingNode).m_ptr = local_58;
  (pNVar3->m_enclosingNode).m_state = pSStack_50;
  if (pSStack_50 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pSStack_50->strongRefCount = pSStack_50->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar8 = &((pNVar3->m_enclosingNode).m_state)->weakRefCount;
    *pdVar8 = *pdVar8 + 1;
    UNLOCK();
  }
  pNVar3->_vptr_Node = (_func_int **)&PTR__Node_00b52880;
  *(undefined1 *)&pNVar3[1]._vptr_Node = 0;
  pSStack_d0 = (SharedPtrStateBase *)0x0;
  local_d8 = pNVar3;
  pSVar4 = (SharedPtrStateBase *)operator_new(0x20);
  pSVar4->strongRefCount = 0;
  pSVar4->weakRefCount = 0;
  pSVar4->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00b52798;
  pSVar4[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar3;
  pSVar4->strongRefCount = 1;
  pSVar4->weakRefCount = 1;
  pSStack_d0 = pSVar4;
  pNVar5 = (Node *)operator_new(0x28);
  pNVar5->_vptr_Node = (_func_int **)&PTR__Node_00b52778;
  pNVar5->m_type = TYPE_VARIABLE;
  (pNVar5->m_enclosingNode).m_ptr = pNVar3;
  (pNVar5->m_enclosingNode).m_state = pSVar4;
  LOCK();
  pSVar4->strongRefCount = pSVar4->strongRefCount + 1;
  UNLOCK();
  LOCK();
  pdVar8 = &((pNVar5->m_enclosingNode).m_state)->weakRefCount;
  *pdVar8 = *pdVar8 + 1;
  UNLOCK();
  pNVar5->_vptr_Node = (_func_int **)&PTR__Node_00b528f0;
  *(undefined4 *)&pNVar5[1]._vptr_Node = 4;
  local_b8.m_state = (SharedPtrStateBase *)0x0;
  local_b8.m_ptr = pNVar5;
  pSVar4 = (SharedPtrStateBase *)operator_new(0x20);
  pSVar4->strongRefCount = 0;
  pSVar4->weakRefCount = 0;
  pSVar4->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00b52798;
  pSVar4[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar5;
  pSVar4->strongRefCount = 1;
  pSVar4->weakRefCount = 1;
  local_b8.m_state = pSVar4;
  pRVar6 = (ResourceTestCase *)operator_new(0xb0);
  ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
            ((ProgramResourceQueryTestTarget *)&local_68,PROGRAMINTERFACE_BUFFER_VARIABLE,0x10);
  ResourceTestCase::ResourceTestCase
            (pRVar6,local_40,&local_b8,(ProgramResourceQueryTestTarget *)&local_68,"unnamed_block");
  tcu::TestNode::addChild(pTVar2,(TestNode *)pRVar6);
  pdVar8 = &pSVar4->strongRefCount;
  LOCK();
  *pdVar8 = *pdVar8 + -1;
  UNLOCK();
  if (*pdVar8 == 0) {
    local_b8.m_ptr = (Node *)0x0;
    (*(local_b8.m_state)->_vptr_SharedPtrStateBase[2])();
  }
  LOCK();
  pdVar8 = &(local_b8.m_state)->weakRefCount;
  *pdVar8 = *pdVar8 + -1;
  UNLOCK();
  if (*pdVar8 == 0) {
    if (local_b8.m_state != (SharedPtrStateBase *)0x0) {
      (*(local_b8.m_state)->_vptr_SharedPtrStateBase[1])();
    }
    local_b8.m_state = (SharedPtrStateBase *)0x0;
  }
  if (pSStack_d0 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar8 = &pSStack_d0->strongRefCount;
    *pdVar8 = *pdVar8 + -1;
    UNLOCK();
    if (*pdVar8 == 0) {
      local_d8 = (Node *)0x0;
      (*pSStack_d0->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar8 = &pSStack_d0->weakRefCount;
    *pdVar8 = *pdVar8 + -1;
    UNLOCK();
    if (*pdVar8 == 0) {
      if (pSStack_d0 != (SharedPtrStateBase *)0x0) {
        (*pSStack_d0->_vptr_SharedPtrStateBase[1])();
      }
      pSStack_d0 = (SharedPtrStateBase *)0x0;
    }
  }
  pNVar3 = (Node *)operator_new(0x28);
  pNVar3->_vptr_Node = (_func_int **)&PTR__Node_00b52778;
  pNVar3->m_type = TYPE_ARRAY_ELEMENT;
  (pNVar3->m_enclosingNode).m_ptr = local_58;
  (pNVar3->m_enclosingNode).m_state = pSStack_50;
  if (pSStack_50 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pSStack_50->strongRefCount = pSStack_50->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar8 = &((pNVar3->m_enclosingNode).m_state)->weakRefCount;
    *pdVar8 = *pdVar8 + 1;
    UNLOCK();
  }
  pNVar3->_vptr_Node = (_func_int **)&PTR__Node_00b528b8;
  *(undefined4 *)&pNVar3[1]._vptr_Node = 0xffffffff;
  pSStack_d0 = (SharedPtrStateBase *)0x0;
  local_d8 = pNVar3;
  pSVar4 = (SharedPtrStateBase *)operator_new(0x20);
  pSVar4->strongRefCount = 0;
  pSVar4->weakRefCount = 0;
  pSVar4->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00b52798;
  pSVar4[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar3;
  pSVar4->strongRefCount = 1;
  pSVar4->weakRefCount = 1;
  pSStack_d0 = pSVar4;
  pNVar5 = (Node *)operator_new(0x28);
  pNVar5->_vptr_Node = (_func_int **)&PTR__Node_00b52778;
  pNVar5->m_type = TYPE_INTERFACE_BLOCK;
  (pNVar5->m_enclosingNode).m_ptr = pNVar3;
  (pNVar5->m_enclosingNode).m_state = pSVar4;
  LOCK();
  pSVar4->strongRefCount = pSVar4->strongRefCount + 1;
  UNLOCK();
  LOCK();
  pdVar8 = &((pNVar5->m_enclosingNode).m_state)->weakRefCount;
  *pdVar8 = *pdVar8 + 1;
  UNLOCK();
  pNVar5->_vptr_Node = (_func_int **)&PTR__Node_00b52880;
  *(undefined1 *)&pNVar5[1]._vptr_Node = 1;
  local_b8.m_state = (SharedPtrStateBase *)0x0;
  local_b8.m_ptr = pNVar5;
  pSVar4 = (SharedPtrStateBase *)operator_new(0x20);
  pSVar4->strongRefCount = 0;
  pSVar4->weakRefCount = 0;
  pSVar4->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00b52798;
  pSVar4[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar5;
  pSVar4->strongRefCount = 1;
  pSVar4->weakRefCount = 1;
  local_b8.m_state = pSVar4;
  pNVar3 = (Node *)operator_new(0x28);
  pNVar3->_vptr_Node = (_func_int **)&PTR__Node_00b52778;
  pNVar3->m_type = TYPE_VARIABLE;
  (pNVar3->m_enclosingNode).m_ptr = pNVar5;
  (pNVar3->m_enclosingNode).m_state = pSVar4;
  LOCK();
  pSVar4->strongRefCount = pSVar4->strongRefCount + 1;
  UNLOCK();
  LOCK();
  pdVar8 = &((pNVar3->m_enclosingNode).m_state)->weakRefCount;
  *pdVar8 = *pdVar8 + 1;
  UNLOCK();
  pNVar3->_vptr_Node = (_func_int **)&PTR__Node_00b528f0;
  *(undefined4 *)&pNVar3[1]._vptr_Node = 4;
  local_68.m_state = (SharedPtrStateBase *)0x0;
  local_68.m_ptr = pNVar3;
  pSVar4 = (SharedPtrStateBase *)operator_new(0x20);
  pSVar4->strongRefCount = 0;
  pSVar4->weakRefCount = 0;
  pSVar4->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00b52798;
  pSVar4[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar3;
  pSVar4->strongRefCount = 1;
  pSVar4->weakRefCount = 1;
  local_68.m_state = pSVar4;
  pRVar6 = (ResourceTestCase *)operator_new(0xb0);
  ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
            (&local_38,PROGRAMINTERFACE_BUFFER_VARIABLE,0x10);
  ResourceTestCase::ResourceTestCase(pRVar6,local_40,&local_68,&local_38,"block_array");
  tcu::TestNode::addChild(pTVar2,(TestNode *)pRVar6);
  pdVar8 = &pSVar4->strongRefCount;
  LOCK();
  *pdVar8 = *pdVar8 + -1;
  UNLOCK();
  if (*pdVar8 == 0) {
    local_68.m_ptr = (Node *)0x0;
    (*(local_68.m_state)->_vptr_SharedPtrStateBase[2])();
  }
  LOCK();
  pdVar8 = &(local_68.m_state)->weakRefCount;
  *pdVar8 = *pdVar8 + -1;
  UNLOCK();
  if (*pdVar8 == 0) {
    if (local_68.m_state != (SharedPtrStateBase *)0x0) {
      (*(local_68.m_state)->_vptr_SharedPtrStateBase[1])();
    }
    local_68.m_state = (SharedPtrStateBase *)0x0;
  }
  if (local_b8.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar8 = &(local_b8.m_state)->strongRefCount;
    *pdVar8 = *pdVar8 + -1;
    UNLOCK();
    if (*pdVar8 == 0) {
      local_b8.m_ptr = (Node *)0x0;
      (*(local_b8.m_state)->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar8 = &(local_b8.m_state)->weakRefCount;
    *pdVar8 = *pdVar8 + -1;
    UNLOCK();
    if (*pdVar8 == 0) {
      if (local_b8.m_state != (SharedPtrStateBase *)0x0) {
        (*(local_b8.m_state)->_vptr_SharedPtrStateBase[1])();
      }
      local_b8.m_state = (SharedPtrStateBase *)0x0;
    }
  }
  if (pSStack_d0 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar8 = &pSStack_d0->strongRefCount;
    *pdVar8 = *pdVar8 + -1;
    UNLOCK();
    if (*pdVar8 == 0) {
      local_d8 = (Node *)0x0;
      (*pSStack_d0->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar8 = &pSStack_d0->weakRefCount;
    *pdVar8 = *pdVar8 + -1;
    UNLOCK();
    if (*pdVar8 == 0) {
      if (pSStack_d0 != (SharedPtrStateBase *)0x0) {
        (*pSStack_d0->_vptr_SharedPtrStateBase[1])();
      }
      pSStack_d0 = (SharedPtrStateBase *)0x0;
    }
  }
  if (pSStack_50 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar8 = &pSStack_50->strongRefCount;
    *pdVar8 = *pdVar8 + -1;
    UNLOCK();
    if (*pdVar8 == 0) {
      local_58 = (Node *)0x0;
      (*pSStack_50->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar8 = &pSStack_50->weakRefCount;
    *pdVar8 = *pdVar8 + -1;
    UNLOCK();
    if (*pdVar8 == 0) {
      if (pSStack_50 != (SharedPtrStateBase *)0x0) {
        (*pSStack_50->_vptr_SharedPtrStateBase[1])();
      }
      pSStack_50 = (SharedPtrStateBase *)0x0;
    }
  }
  if (local_78.m_state != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar8 = &(local_78.m_state)->strongRefCount;
    *pdVar8 = *pdVar8 + -1;
    UNLOCK();
    if (*pdVar8 == 0) {
      local_78.m_ptr = (Node *)0x0;
      (*(local_78.m_state)->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar8 = &(local_78.m_state)->weakRefCount;
    *pdVar8 = *pdVar8 + -1;
    UNLOCK();
    if (*pdVar8 == 0) {
      if (local_78.m_state != (SharedPtrStateBase *)0x0) {
        (*(local_78.m_state)->_vptr_SharedPtrStateBase[1])();
      }
      local_78.m_state = (SharedPtrStateBase *)0x0;
    }
  }
  if (pSStack_a0 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar8 = &pSStack_a0->strongRefCount;
    *pdVar8 = *pdVar8 + -1;
    UNLOCK();
    if (*pdVar8 == 0) {
      local_a8 = (Node *)0x0;
      (*pSStack_a0->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar8 = &pSStack_a0->weakRefCount;
    *pdVar8 = *pdVar8 + -1;
    UNLOCK();
    if (*pdVar8 == 0) {
      if (pSStack_a0 != (SharedPtrStateBase *)0x0) {
        (*pSStack_a0->_vptr_SharedPtrStateBase[1])();
      }
      pSStack_a0 = (SharedPtrStateBase *)0x0;
    }
  }
  if (pSStack_90 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar8 = &pSStack_90->strongRefCount;
    *pdVar8 = *pdVar8 + -1;
    UNLOCK();
    if (*pdVar8 == 0) {
      local_98 = (Node *)0x0;
      (*pSStack_90->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar8 = &pSStack_90->weakRefCount;
    *pdVar8 = *pdVar8 + -1;
    UNLOCK();
    if (*pdVar8 == 0) {
      if (pSStack_90 != (SharedPtrStateBase *)0x0) {
        (*pSStack_90->_vptr_SharedPtrStateBase[1])();
      }
      pSStack_90 = (SharedPtrStateBase *)0x0;
    }
  }
  if (pSStack_80 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar8 = &pSStack_80->strongRefCount;
    *pdVar8 = *pdVar8 + -1;
    UNLOCK();
    if (*pdVar8 == 0) {
      local_88 = (Node *)0x0;
      (*pSStack_80->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar8 = &pSStack_80->weakRefCount;
    *pdVar8 = *pdVar8 + -1;
    UNLOCK();
    if (*pdVar8 == 0) {
      if (pSStack_80 != (SharedPtrStateBase *)0x0) {
        (*pSStack_80->_vptr_SharedPtrStateBase[1])();
      }
      pSStack_80 = (SharedPtrStateBase *)0x0;
    }
  }
  pTVar2 = (TestNode *)operator_new(0x78);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,pCVar1->m_testCtx,"is_row_major","Is row major");
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b41ef0;
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  generateBufferVariableMatrixCaseBlocks
            ((this->super_TestCaseGroup).m_context,(TestCaseGroup *)pTVar2,glslVersion,
             generateBufferVariableMatrixCases<(deqp::gles31::Functional::ProgramResourcePropFlags)64>
            );
  pTVar2 = (TestNode *)operator_new(0x78);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,pCVar1->m_testCtx,"matrix_stride","Matrix stride");
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b41ef0;
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  generateBufferVariableMatrixCaseBlocks
            ((this->super_TestCaseGroup).m_context,(TestCaseGroup *)pTVar2,glslVersion,
             generateBufferVariableMatrixCases<(deqp::gles31::Functional::ProgramResourcePropFlags)128>
            );
  pTVar2 = (TestNode *)operator_new(0x78);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,pCVar1->m_testCtx,"name_length","Name length");
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b41ef0;
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  generateBufferVariableBufferCaseBlocks
            ((this->super_TestCaseGroup).m_context,(TestCaseGroup *)pTVar2,glslVersion,
             generateBufferVariableNameLengthCases);
  pTVar2 = (TestNode *)operator_new(0x78);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)pTVar2,pCVar1->m_testCtx,"offset","Offset");
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b41ef0;
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  generateBufferVariableBufferCaseBlocks
            ((this->super_TestCaseGroup).m_context,(TestCaseGroup *)pTVar2,glslVersion,
             generateBufferVariableOffsetCases);
  pTVar2 = (TestNode *)operator_new(0x78);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,pCVar1->m_testCtx,"referenced_by","Referenced by");
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b41ef0;
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  generateReferencedByShaderCaseBlocks
            ((this->super_TestCaseGroup).m_context,(TestCaseGroup *)pTVar2,glslVersion,
             generateBufferVariableReferencedByBlockContents);
  pTVar2 = (TestNode *)operator_new(0x78);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,pCVar1->m_testCtx,"top_level_array_size","Top-level array size"
            );
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b41ef0;
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  generateBufferVariableBufferCaseBlocks
            ((this->super_TestCaseGroup).m_context,(TestCaseGroup *)pTVar2,glslVersion,
             generateBufferVariableTopLevelCases<(deqp::gles31::Functional::ProgramResourcePropFlags)32768>
            );
  pTVar2 = (TestNode *)operator_new(0x78);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,pCVar1->m_testCtx,"top_level_array_stride",
             "Top-level array stride");
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b41ef0;
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  generateBufferVariableBufferCaseBlocks
            ((this->super_TestCaseGroup).m_context,(TestCaseGroup *)pTVar2,glslVersion,
             generateBufferVariableTopLevelCases<(deqp::gles31::Functional::ProgramResourcePropFlags)65536>
            );
  pTVar2 = (TestNode *)operator_new(0x78);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)pTVar2,pCVar1->m_testCtx,"type","Type");
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b41ef0;
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  local_40 = (this->super_TestCaseGroup).m_context;
  pNVar3 = (Node *)operator_new(0x28);
  pNVar3->m_type = TYPE_PROGRAM;
  (pNVar3->m_enclosingNode).m_ptr = (Node *)0x0;
  (pNVar3->m_enclosingNode).m_state = (SharedPtrStateBase *)0x0;
  pNVar3->_vptr_Node = (_func_int **)&PTR__Node_00b52730;
  *(undefined1 *)&pNVar3[1]._vptr_Node = 0;
  pSStack_d0 = (SharedPtrStateBase *)0x0;
  local_d8 = pNVar3;
  pSVar4 = (SharedPtrStateBase *)operator_new(0x20);
  pSVar4->strongRefCount = 0;
  pSVar4->weakRefCount = 0;
  pSVar4->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00b52798;
  pSVar4[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar3;
  pSVar4->strongRefCount = 1;
  pSVar4->weakRefCount = 1;
  pSStack_d0 = pSVar4;
  pNVar5 = (Node *)operator_new(0x28);
  pNVar5->_vptr_Node = (_func_int **)&PTR__Node_00b52778;
  pNVar5->m_type = TYPE_SHADER;
  (pNVar5->m_enclosingNode).m_ptr = pNVar3;
  (pNVar5->m_enclosingNode).m_state = pSVar4;
  LOCK();
  pSVar4->strongRefCount = pSVar4->strongRefCount + 1;
  UNLOCK();
  LOCK();
  pdVar8 = &((pNVar5->m_enclosingNode).m_state)->weakRefCount;
  *pdVar8 = *pdVar8 + 1;
  UNLOCK();
  pNVar5->_vptr_Node = (_func_int **)&PTR__Node_00b527d8;
  *(undefined4 *)&pNVar5[1]._vptr_Node = 5;
  *(GLSLVersion *)((long)&pNVar5[1]._vptr_Node + 4) = glslVersion;
  pSStack_80 = (SharedPtrStateBase *)0x0;
  local_88 = pNVar5;
  pSVar4 = (SharedPtrStateBase *)operator_new(0x20);
  pSVar4->strongRefCount = 0;
  pSVar4->weakRefCount = 0;
  pSVar4->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00b52798;
  pSVar4[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar5;
  pSVar4->strongRefCount = 1;
  pSVar4->weakRefCount = 1;
  pSStack_80 = pSVar4;
  pNVar3 = (Node *)operator_new(0x20);
  pNVar3->_vptr_Node = (_func_int **)&PTR__Node_00b52778;
  pNVar3->m_type = TYPE_DEFAULT_BLOCK;
  (pNVar3->m_enclosingNode).m_ptr = pNVar5;
  (pNVar3->m_enclosingNode).m_state = pSVar4;
  LOCK();
  pSVar4->strongRefCount = pSVar4->strongRefCount + 1;
  UNLOCK();
  LOCK();
  pdVar8 = &((pNVar3->m_enclosingNode).m_state)->weakRefCount;
  *pdVar8 = *pdVar8 + 1;
  UNLOCK();
  pNVar3->_vptr_Node = (_func_int **)&PTR__Node_00b52810;
  pSStack_90 = (SharedPtrStateBase *)0x0;
  local_98 = pNVar3;
  pSVar4 = (SharedPtrStateBase *)operator_new(0x20);
  pSVar4->strongRefCount = 0;
  pSVar4->weakRefCount = 0;
  pSVar4->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00b52798;
  pSVar4[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar3;
  pSVar4->strongRefCount = 1;
  pSVar4->weakRefCount = 1;
  pSStack_90 = pSVar4;
  pNVar5 = (Node *)operator_new(0x28);
  pNVar5->_vptr_Node = (_func_int **)&PTR__Node_00b52778;
  pNVar5->m_type = TYPE_STORAGE_QUALIFIER;
  (pNVar5->m_enclosingNode).m_ptr = pNVar3;
  (pNVar5->m_enclosingNode).m_state = pSVar4;
  LOCK();
  pSVar4->strongRefCount = pSVar4->strongRefCount + 1;
  UNLOCK();
  LOCK();
  pdVar8 = &((pNVar5->m_enclosingNode).m_state)->weakRefCount;
  *pdVar8 = *pdVar8 + 1;
  UNLOCK();
  pNVar5->_vptr_Node = (_func_int **)&PTR__Node_00b52848;
  *(undefined4 *)&pNVar5[1]._vptr_Node = 4;
  pSStack_a0 = (SharedPtrStateBase *)0x0;
  local_a8 = pNVar5;
  pSVar4 = (SharedPtrStateBase *)operator_new(0x20);
  pSVar4->strongRefCount = 0;
  pSVar4->weakRefCount = 0;
  pSVar4->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00b52798;
  pSVar4[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar5;
  pSVar4->strongRefCount = 1;
  pSVar4->weakRefCount = 1;
  pSStack_a0 = pSVar4;
  pNVar3 = (Node *)operator_new(0x28);
  pNVar3->_vptr_Node = (_func_int **)&PTR__Node_00b52778;
  pNVar3->m_type = TYPE_INTERFACE_BLOCK;
  (pNVar3->m_enclosingNode).m_ptr = pNVar5;
  (pNVar3->m_enclosingNode).m_state = pSVar4;
  LOCK();
  pSVar4->strongRefCount = pSVar4->strongRefCount + 1;
  UNLOCK();
  LOCK();
  pdVar8 = &((pNVar3->m_enclosingNode).m_state)->weakRefCount;
  *pdVar8 = *pdVar8 + 1;
  UNLOCK();
  pNVar3->_vptr_Node = (_func_int **)&PTR__Node_00b52880;
  *(undefined1 *)&pNVar3[1]._vptr_Node = 1;
  local_78.m_state = (SharedPtrStateBase *)0x0;
  local_78.m_ptr = pNVar3;
  pSVar4 = (SharedPtrStateBase *)operator_new(0x20);
  pSVar4->strongRefCount = 0;
  pSVar4->weakRefCount = 0;
  pSVar4->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00b52798;
  pSVar4[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar3;
  pSVar4->strongRefCount = 1;
  pSVar4->weakRefCount = 1;
  local_78.m_state = pSVar4;
  generateBufferVariableTypeCases(local_40,&local_78,(TestCaseGroup *)pTVar2,3);
  pdVar8 = &pSVar4->strongRefCount;
  LOCK();
  *pdVar8 = *pdVar8 + -1;
  UNLOCK();
  if (*pdVar8 == 0) {
    local_78.m_ptr = (Node *)0x0;
    (*(local_78.m_state)->_vptr_SharedPtrStateBase[2])();
  }
  LOCK();
  pdVar8 = &(local_78.m_state)->weakRefCount;
  *pdVar8 = *pdVar8 + -1;
  UNLOCK();
  if (*pdVar8 == 0) {
    if (local_78.m_state != (SharedPtrStateBase *)0x0) {
      (*(local_78.m_state)->_vptr_SharedPtrStateBase[1])();
    }
    local_78.m_state = (SharedPtrStateBase *)0x0;
  }
  if (pSStack_a0 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar8 = &pSStack_a0->strongRefCount;
    *pdVar8 = *pdVar8 + -1;
    UNLOCK();
    if (*pdVar8 == 0) {
      local_a8 = (Node *)0x0;
      (*pSStack_a0->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar8 = &pSStack_a0->weakRefCount;
    *pdVar8 = *pdVar8 + -1;
    UNLOCK();
    if (*pdVar8 == 0) {
      if (pSStack_a0 != (SharedPtrStateBase *)0x0) {
        (*pSStack_a0->_vptr_SharedPtrStateBase[1])();
      }
      pSStack_a0 = (SharedPtrStateBase *)0x0;
    }
  }
  if (pSStack_90 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar8 = &pSStack_90->strongRefCount;
    *pdVar8 = *pdVar8 + -1;
    UNLOCK();
    if (*pdVar8 == 0) {
      local_98 = (Node *)0x0;
      (*pSStack_90->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar8 = &pSStack_90->weakRefCount;
    *pdVar8 = *pdVar8 + -1;
    UNLOCK();
    if (*pdVar8 == 0) {
      if (pSStack_90 != (SharedPtrStateBase *)0x0) {
        (*pSStack_90->_vptr_SharedPtrStateBase[1])();
      }
      pSStack_90 = (SharedPtrStateBase *)0x0;
    }
  }
  if (pSStack_80 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar8 = &pSStack_80->strongRefCount;
    *pdVar8 = *pdVar8 + -1;
    UNLOCK();
    if (*pdVar8 == 0) {
      local_88 = (Node *)0x0;
      (*pSStack_80->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar8 = &pSStack_80->weakRefCount;
    *pdVar8 = *pdVar8 + -1;
    UNLOCK();
    if (*pdVar8 == 0) {
      if (pSStack_80 != (SharedPtrStateBase *)0x0) {
        (*pSStack_80->_vptr_SharedPtrStateBase[1])();
      }
      pSStack_80 = (SharedPtrStateBase *)0x0;
    }
  }
  if (pSStack_d0 != (SharedPtrStateBase *)0x0) {
    LOCK();
    pdVar8 = &pSStack_d0->strongRefCount;
    *pdVar8 = *pdVar8 + -1;
    UNLOCK();
    if (*pdVar8 == 0) {
      local_d8 = (Node *)0x0;
      (*pSStack_d0->_vptr_SharedPtrStateBase[2])();
    }
    LOCK();
    pdVar8 = &pSStack_d0->weakRefCount;
    *pdVar8 = *pdVar8 + -1;
    UNLOCK();
    if (*pdVar8 == 0) {
      if (pSStack_d0 != (SharedPtrStateBase *)0x0) {
        (*pSStack_d0->_vptr_SharedPtrStateBase[1])();
      }
      pSStack_d0 = (SharedPtrStateBase *)0x0;
    }
  }
  pTVar2 = (TestNode *)operator_new(0x78);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)pTVar2,pCVar1->m_testCtx,"random","Random");
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_00b41ef0;
  pTVar2[1]._vptr_TestNode = (_func_int **)pCVar1;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pCVar1 = (this->super_TestCaseGroup).m_context;
  iVar7 = 0;
  do {
    generateBufferVariableRandomCase(pCVar1,(TestCaseGroup *)pTVar2,glslVersion,iVar7,false);
    iVar7 = iVar7 + 1;
  } while (iVar7 != 0x28);
  iVar7 = 0x28;
  do {
    generateBufferVariableRandomCase(pCVar1,(TestCaseGroup *)pTVar2,glslVersion,iVar7,true);
    iVar7 = iVar7 + 1;
  } while (iVar7 != 0x50);
  return extraout_EAX;
}

Assistant:

void BufferVariableTestGroup::init (void)
{
	const glu::GLSLVersion glslVersion = glu::getContextTypeGLSLVersion(m_context.getRenderContext().getType());

	// .resource_list
	{
		tcu::TestCaseGroup* const blockGroup = new TestCaseGroup(m_context, "resource_list", "Resource list");
		addChild(blockGroup);
		generateBufferVariableBufferCaseBlocks(m_context, blockGroup, glslVersion, generateBufferVariableResourceListBlockContentsProxy);
	}

	// .array_size
	{
		tcu::TestCaseGroup* const blockGroup = new TestCaseGroup(m_context, "array_size", "Array size");
		addChild(blockGroup);
		generateBufferVariableBufferCaseBlocks(m_context, blockGroup, glslVersion, generateBufferVariableArrayCases<PROGRAMRESOURCEPROP_ARRAY_SIZE>);
	}

	// .array_stride
	{
		tcu::TestCaseGroup* const blockGroup = new TestCaseGroup(m_context, "array_stride", "Array stride");
		addChild(blockGroup);
		generateBufferVariableBufferCaseBlocks(m_context, blockGroup, glslVersion, generateBufferVariableArrayCases<PROGRAMRESOURCEPROP_ARRAY_STRIDE>);
	}

	// .block_index
	{
		tcu::TestCaseGroup* const blockGroup = new TestCaseGroup(m_context, "block_index", "Block index");
		addChild(blockGroup);
		generateBufferVariableBlockIndexCases(m_context, glslVersion, blockGroup);
	}

	// .is_row_major
	{
		tcu::TestCaseGroup* const blockGroup = new TestCaseGroup(m_context, "is_row_major", "Is row major");
		addChild(blockGroup);
		generateBufferVariableMatrixCaseBlocks(m_context, blockGroup, glslVersion, generateBufferVariableMatrixCases<PROGRAMRESOURCEPROP_MATRIX_ROW_MAJOR>);
	}

	// .matrix_stride
	{
		tcu::TestCaseGroup* const blockGroup = new TestCaseGroup(m_context, "matrix_stride", "Matrix stride");
		addChild(blockGroup);
		generateBufferVariableMatrixCaseBlocks(m_context, blockGroup, glslVersion, generateBufferVariableMatrixCases<PROGRAMRESOURCEPROP_MATRIX_STRIDE>);
	}

	// .name_length
	{
		tcu::TestCaseGroup* const blockGroup = new TestCaseGroup(m_context, "name_length", "Name length");
		addChild(blockGroup);
		generateBufferVariableBufferCaseBlocks(m_context, blockGroup, glslVersion, generateBufferVariableNameLengthCases);
	}

	// .offset
	{
		tcu::TestCaseGroup* const blockGroup = new TestCaseGroup(m_context, "offset", "Offset");
		addChild(blockGroup);
		generateBufferVariableBufferCaseBlocks(m_context, blockGroup, glslVersion, generateBufferVariableOffsetCases);
	}

	// .referenced_by
	{
		tcu::TestCaseGroup* const blockGroup = new TestCaseGroup(m_context, "referenced_by", "Referenced by");
		addChild(blockGroup);
		generateReferencedByShaderCaseBlocks(m_context, blockGroup, glslVersion, generateBufferVariableReferencedByBlockContents);
	}

	// .top_level_array_size
	{
		tcu::TestCaseGroup* const blockGroup = new TestCaseGroup(m_context, "top_level_array_size", "Top-level array size");
		addChild(blockGroup);
		generateBufferVariableBufferCaseBlocks(m_context, blockGroup, glslVersion, generateBufferVariableTopLevelCases<PROGRAMRESOURCEPROP_TOP_LEVEL_ARRAY_SIZE>);
	}

	// .top_level_array_stride
	{
		tcu::TestCaseGroup* const blockGroup = new TestCaseGroup(m_context, "top_level_array_stride", "Top-level array stride");
		addChild(blockGroup);
		generateBufferVariableBufferCaseBlocks(m_context, blockGroup, glslVersion, generateBufferVariableTopLevelCases<PROGRAMRESOURCEPROP_TOP_LEVEL_ARRAY_STRIDE>);
	}

	// .type
	{
		tcu::TestCaseGroup* const blockGroup = new TestCaseGroup(m_context, "type", "Type");
		addChild(blockGroup);
		generateBufferVariableTypeBlock(m_context, blockGroup, glslVersion);
	}

	// .random
	{
		tcu::TestCaseGroup* const blockGroup = new TestCaseGroup(m_context, "random", "Random");
		addChild(blockGroup);
		generateBufferVariableRandomCases(m_context, blockGroup, glslVersion);
	}
}